

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

char * duplicate_stringlist(char *input)

{
  size_t sVar1;
  char *local_28;
  char *in_tail;
  char *result;
  char *input_local;
  
  local_28 = input;
  if (input == (char *)0x0) {
    input_local = strdup("");
  }
  else {
    for (; *local_28 != '\0'; local_28 = local_28 + sVar1 + 1) {
      sVar1 = strlen(local_28);
    }
    input_local = (char *)malloc((size_t)(local_28 + (1 - (long)input)));
    if (input_local == (char *)0x0) {
      input_local = (char *)0x0;
    }
    else {
      memcpy(input_local,input,(size_t)(local_28 + (1 - (long)input)));
    }
  }
  return input_local;
}

Assistant:

static char *duplicate_stringlist(const char *input)
{
    if (input == NULL)
        return strdup("");

    char *result;
    const char *in_tail;

    for (in_tail = input; in_tail[0] != '\0'; in_tail += strlen(in_tail) + 1)
        ;
    ++in_tail;
    if ((result = malloc(in_tail - input)) == NULL)
        return NULL;
    memcpy(result, input, in_tail - input);
    return result;
}